

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O2

void HU_GetPlayerWidths(int *maxnamewidth,int *maxscorewidth,int *maxiconheight)

{
  uint uVar1;
  FFont *this;
  int iVar2;
  int iVar3;
  BYTE *string;
  int i;
  long lVar4;
  userinfo_t *this_00;
  FTexture *this_01;
  
  iVar2 = FFont::StringWidth(SmallFont,"Name");
  *maxnamewidth = iVar2;
  *maxscorewidth = 0;
  *maxiconheight = 0;
  this_00 = (userinfo_t *)&DAT_009ba458;
  for (lVar4 = 0; this = SmallFont, lVar4 != 8; lVar4 = lVar4 + 1) {
    if (playeringame[lVar4] == true) {
      string = (BYTE *)userinfo_t::GetName(this_00);
      iVar2 = FFont::StringWidth(this,string);
      if (*maxnamewidth < iVar2) {
        *maxnamewidth = iVar2;
      }
      uVar1 = *(uint *)(*(long *)&this_00[-3].
                                  super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                  .Size + 0x508);
      if (0 < (long)(int)uVar1) {
        if (uVar1 < TexMan.Textures.Count) {
          this_01 = TexMan.Textures.Array[(int)uVar1].Texture;
        }
        else {
          this_01 = (FTexture *)0x0;
        }
        iVar2 = FTexture::GetScaledWidth(this_01);
        iVar3 = FTexture::GetScaledLeftOffset(this_01);
        iVar2 = (iVar2 - iVar3) + 2;
        if (*maxscorewidth < iVar2) {
          *maxscorewidth = iVar2;
        }
        iVar2 = FTexture::GetScaledHeight(this_01);
        iVar3 = FTexture::GetScaledTopOffset(this_01);
        if (*maxiconheight < iVar2 - iVar3) {
          *maxiconheight = iVar2 - iVar3;
        }
      }
    }
    this_00 = this_00 + 0x1c;
  }
  return;
}

Assistant:

void HU_GetPlayerWidths(int &maxnamewidth, int &maxscorewidth, int &maxiconheight)
{
	maxnamewidth = SmallFont->StringWidth("Name");
	maxscorewidth = 0;
	maxiconheight = 0;

	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			int width = SmallFont->StringWidth(players[i].userinfo.GetName());
			if (width > maxnamewidth)
			{
				maxnamewidth = width;
			}
			if (players[i].mo->ScoreIcon.isValid())
			{
				FTexture *pic = TexMan[players[i].mo->ScoreIcon];
				width = pic->GetScaledWidth() - pic->GetScaledLeftOffset() + 2;
				if (width > maxscorewidth)
				{
					maxscorewidth = width;
				}
				// The icon's top offset does not count toward its height, because
				// zdoom.pk3's standard Hexen class icons are designed that way.
				int height = pic->GetScaledHeight() - pic->GetScaledTopOffset();
				if (height > maxiconheight)
				{
					maxiconheight = height;
				}
			}
		}
	}
}